

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt.cpp
# Opt level: O1

void R_FillColumnHorizP(void)

{
  uint *puVar1;
  BYTE BVar2;
  int iVar3;
  uint uVar4;
  BYTE *pBVar5;
  long lVar6;
  
  iVar3 = dc_count;
  BVar2 = (BYTE)dc_color;
  if (0 < dc_count) {
    uVar4 = dc_x & 3;
    puVar1 = dc_ctspan[uVar4];
    *puVar1 = dc_yl;
    puVar1[1] = dc_yh;
    dc_ctspan[uVar4] = puVar1 + 2;
    pBVar5 = dc_temp + (ulong)uVar4 + (long)dc_yl * 4;
    if ((iVar3 & 1U) != 0) {
      *pBVar5 = BVar2;
      pBVar5 = pBVar5 + 4;
    }
    if (iVar3 != 1) {
      lVar6 = 0;
      do {
        pBVar5[lVar6 * 8] = BVar2;
        pBVar5[lVar6 * 8 + 4] = BVar2;
        lVar6 = lVar6 + 1;
      } while ((uint)iVar3 >> 1 != (uint)lVar6);
    }
  }
  return;
}

Assistant:

void R_FillColumnHorizP (void)
{
	int count = dc_count;
	BYTE color = dc_color;
	BYTE *dest;

	if (count <= 0)
		return;

	{
		int x = dc_x & 3;
		unsigned int **span = &dc_ctspan[x];

		(*span)[0] = dc_yl;
		(*span)[1] = dc_yh;
		*span += 2;
		dest = &dc_temp[x + 4*dc_yl];
	}

	if (count & 1) {
		*dest = color;
		dest += 4;
	}
	if (!(count >>= 1))
		return;
	do {
		dest[0] = color; dest[4] = color;
		dest += 8;
	} while (--count);
}